

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HAPI.cpp
# Opt level: O3

void solve_fromArrays(int *probStatus,int *basisStatus,int XnumCol,int XnumRow,int XnumNz,
                     int XobjSense,int XobjOffset,double *XcolCost,double *XcolLower,
                     double *XcolUpper,double *XrowLower,double *XrowUpper,int *XAstart,int *XAindex
                     ,double *XAvalue,double *colPrimalValues,double *colDualValues,
                     double *rowPrimalValues,double *rowDualValues,int *basicVariables)

{
  size_t __n;
  undefined4 *puVar1;
  long lVar2;
  vector<double,_std::allocator<double>_> XcolDualValues;
  vector<double,_std::allocator<double>_> XcolPrimalValues;
  HModel model;
  HDual solver;
  vector<double,_std::allocator<double>_> vStack_15d48;
  vector<double,_std::allocator<double>_> vStack_15d28;
  vector<double,_std::allocator<double>_> vStack_15d08;
  vector<double,_std::allocator<double>_> vStack_15ce8;
  HModel HStack_15cd0;
  HDual HStack_14b40;
  
  HModel::HModel(&HStack_15cd0);
  HModel::load_fromArrays
            (&HStack_15cd0,XnumCol,XobjSense,XcolCost,XcolLower,XcolUpper,XnumRow,XrowLower,
             XrowUpper,XnumNz,XAstart,XAindex,XAvalue);
  HModel::scaleModel(&HStack_15cd0);
  if (*basisStatus != 0) {
    HModel::replaceWithNewBasis(&HStack_15cd0,basicVariables);
  }
  lVar2 = 0x8a8;
  do {
    memset((void *)((long)&HStack_14b40.dual_variant + lVar2),0,0xa8);
    lVar2 = lVar2 + 0xb0;
  } while (lVar2 != 0x4d68);
  lVar2 = 0x4de8;
  do {
    *(undefined8 *)
     ((long)&HStack_15cd0.SvColLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvColLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.dualColUpperImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.dualColUpperImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.dualColLowerImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.dualColUpperImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvColUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvColUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvRowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvRowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvRowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvRowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.dual_variant + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.Crash_Mode + lVar2) = 0;
    *(undefined8 *)(&HStack_14b40.SolveBailout + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.TimeLimitValue + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.totalRebuilds + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.totalRebuildTime + lVar2) = 0;
    lVar2 = lVar2 + 0xb8;
  } while (lVar2 != 0x95c8);
  lVar2 = 0x9578;
  do {
    puVar1 = (undefined4 *)((long)&HStack_14b40.dual_variant + lVar2);
    *puVar1 = 0;
    *(undefined8 *)((long)&HStack_14b40.Crash_Mode + lVar2) = 0;
    *(undefined4 **)(&HStack_14b40.SolveBailout + lVar2) = puVar1;
    *(undefined4 **)((long)&HStack_14b40.TimeLimitValue + lVar2) = puVar1;
    *(undefined8 *)((long)&HStack_14b40.totalRebuilds + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.n_dvx_fwk + lVar2) = 0;
    *(undefined8 *)(&HStack_14b40.nw_dvx_fwk + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_14b40.dvx_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_14b40.dvx_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data + lVar2 + 8) = 0;
    *(undefined8 *)
     ((long)&HStack_14b40.dvx_ix.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data + lVar2 + 0x10) = 0;
    *(undefined8 *)(&HStack_14b40.iz_DSE_wt + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.numTot + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.matrix + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.factor + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.jMove + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.workRange + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.baseLower + lVar2) = 0;
    lVar2 = lVar2 + 0xe8;
  } while (lVar2 != 0xf018);
  lVar2 = 0xf228;
  do {
    *(undefined8 *)
     ((long)&HStack_15cd0.bufferLong.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data + lVar2 + 8) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.bufferLong.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data + lVar2 + 0x10) = 0;
    *(undefined8 *)((long)&HStack_15cd0.bufferLong.fakeTick + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.bufferLong.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.bufferLong.array.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data + lVar2 + 0x10) = 0;
    *(undefined8 *)((long)&HStack_15cd0.bufferLong.pseudoTick + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.bufferLong.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data + lVar2 + 0x10) = 0;
    *(undefined8 *)((long)&HStack_15cd0.bufferLong.next + lVar2) = 0;
    *(undefined8 *)(&HStack_15cd0.bufferLong.packFlag + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.bufferLong.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.bufferLong.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data + lVar2 + 8) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.bufferLong.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data + lVar2 + 0x10) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.bufferLong.packValue.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data + lVar2 + 0x10) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.historyColumnIn.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.historyColumnIn.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.historyColumnIn.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.historyColumnOut.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.historyColumnOut.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.historyAlpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.historyAlpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.historyAlpha.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.primalColLowerImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.primalColLowerImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.primalColLowerImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.primalColUpperImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.primalRowLowerImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.primalRowLowerImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.primalRowLowerImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.primalRowUpperImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.primalRowUpperImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.dualRowUpperImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.dualColLowerImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.dualRowUpperImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.dualRowUpperImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.dualRowLowerImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.dualRowLowerImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvColLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvColLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.dualColUpperImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.dualColUpperImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.dualColLowerImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.dualColUpperImplied.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvColUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvColUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvRowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvRowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvRowLower.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage + lVar2) = 0;
    *(undefined8 *)
     ((long)&HStack_15cd0.SvRowUpper.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.dual_variant + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.Crash_Mode + lVar2) = 0;
    *(undefined8 *)(&HStack_14b40.SolveBailout + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.TimeLimitValue + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.totalRebuilds + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.totalRebuildTime + lVar2) = 0;
    lVar2 = lVar2 + 0x260;
  } while (lVar2 != 0x13e28);
  lVar2 = 0x13c08;
  do {
    *(undefined8 *)((long)&HStack_14b40.dual_variant + lVar2) = 0;
    *(undefined8 *)((long)&HStack_14b40.Crash_Mode + lVar2) = 0;
    *(undefined8 *)(&HStack_14b40.SolveBailout + lVar2) = 0;
    lVar2 = lVar2 + 0x78;
  } while (lVar2 != 0x14b08);
  HDual::solve(&HStack_14b40,&HStack_15cd0,0,1);
  vStack_15ce8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_15ce8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_15ce8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_15d08.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_15d08.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_15d08.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_15d28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_15d28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_15d28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vStack_15d48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_15d48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vStack_15d48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  HModel::util_getPrimalDualValues
            (&HStack_15cd0,&vStack_15ce8,&vStack_15d08,&vStack_15d28,&vStack_15d48);
  memcpy(colPrimalValues,
         vStack_15ce8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,(long)HStack_15cd0.numCol << 3);
  __n = (long)HStack_15cd0.numRow * 8;
  memcpy(rowPrimalValues,
         vStack_15d28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,__n);
  memcpy(colDualValues,
         vStack_15d08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,(long)HStack_15cd0.numCol << 3);
  memcpy(rowDualValues,
         vStack_15d48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start,__n);
  memcpy(basicVariables,
         HStack_15cd0.basicIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start,(long)HStack_15cd0.numRow << 2);
  HModel::util_reportSolverOutcome(&HStack_15cd0,"Solve plain API");
  HModel::util_reportModelDense(&HStack_15cd0);
  *probStatus = HStack_15cd0.problemStatus;
  *basisStatus = 1;
  HModel::clearModel(&HStack_15cd0);
  if (vStack_15d48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_15d48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (vStack_15d28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_15d28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (vStack_15d08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_15d08.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (vStack_15ce8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_15ce8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  HDual::~HDual(&HStack_14b40);
  HModel::~HModel(&HStack_15cd0);
  return;
}

Assistant:

void solve_fromArrays(int* probStatus, int* basisStatus,
		      const int XnumCol, const int XnumRow, const int XnumNz, 
		      const int XobjSense, const int XobjOffset,
		      const double* XcolCost, const double* XcolLower, const double* XcolUpper,
		      const double* XrowLower, const double* XrowUpper,
		      const int* XAstart, const int* XAindex, const double* XAvalue,
		      double* colPrimalValues, double* colDualValues,
		      double* rowPrimalValues, double* rowDualValues,
		      int* basicVariables) {
  HModel model;
  model.load_fromArrays(XnumCol, XobjSense, XcolCost, XcolLower, XcolUpper,
			XnumRow, XrowLower, XrowUpper,
			XnumNz, XAstart, XAindex, XAvalue);
  model.scaleModel();

  int LcBasisStatus = (*basisStatus);
  //printf("solve_fromArrays: LcBasisStatus = %d\n", LcBasisStatus);fflush(stdout);
  if (LcBasisStatus) {
    //    printf("Basis status is %d\n", LcBasisStatus);
    model.replaceWithNewBasis(basicVariables);
    //    printf("Number of basic logicals is %d\n", model.numBasicLogicals);
  }

  HDual solver;
  solver.solve(&model);
  
  vector<double> XcolPrimalValues;
  vector<double> XcolDualValues;
  vector<double> XrowPrimalValues;
  vector<double> XrowDualValues;
  vector<double> XbasicVariables;
  
  model.util_getPrimalDualValues(XcolPrimalValues, XcolDualValues, XrowPrimalValues, XrowDualValues);

  memcpy(colPrimalValues, &(XcolPrimalValues[0]), sizeof(double)*model.numCol);
  memcpy(rowPrimalValues, &(XrowPrimalValues[0]), sizeof(double)*model.numRow);
  memcpy(colDualValues, &(XcolDualValues[0]), sizeof(double)*model.numCol);
  memcpy(rowDualValues, &(XrowDualValues[0]), sizeof(double)*model.numRow);
  memcpy(basicVariables, &(model.basicIndex[0]), sizeof(int)*model.numRow);
  LcBasisStatus = HiGHS_basisStatus_yes;
  model.util_reportSolverOutcome("Solve plain API");
#ifdef JAJH_dev
  model.util_reportModelDense();
#endif
  //  model.util_reportModel();
  //  model.util_reportModelSolution();

  //  printf("model.problemStatus = %d\n", model.problemStatus);
  (*probStatus) = model.problemStatus;
  (*basisStatus) = LcBasisStatus;
// Remove any current model
  model.clearModel();
  //  printf("solve_fromArrays: probStatus = %d\n", (*probStatus));
  return;
}